

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  int fragNdx;
  int fragNdx_00;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  Vec4 color;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 gradientMax;
  Vec4 gradientMin;
  deUint32 local_d0;
  deUint32 local_cc;
  deUint32 local_c8;
  deUint32 local_c4;
  FragmentPacket *local_c0;
  ulong local_b8;
  ulong local_b0;
  GradientShader *local_a8;
  FragmentPacket *local_a0;
  Vector<float,_4> local_98;
  float local_88;
  float local_84;
  deUint32 local_78;
  deUint32 dStack_74;
  deUint32 dStack_70;
  deUint32 dStack_6c;
  deUint32 local_68;
  deUint32 dStack_64;
  deUint32 dStack_60;
  deUint32 dStack_5c;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  local_c0 = packets;
  tcu::Vector<float,_4>::Vector
            (&local_40,
             (float (*) [4])
             &((this->super_ShaderProgram).m_uniforms.
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start)->value);
  local_a8 = this;
  tcu::Vector<float,_4>::Vector
            (&local_50,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[1].value);
  iVar1 = 0;
  if (numPackets < 1) {
    numPackets = 0;
  }
  local_b8 = (ulong)(uint)numPackets;
  local_b0 = 0;
  do {
    if (local_b0 == local_b8) {
      return;
    }
    local_a0 = local_c0 + local_b0;
    for (fragNdx_00 = 0; fragNdx_00 != 4; fragNdx_00 = fragNdx_00 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_88,local_a0,context,0,fragNdx_00);
      local_98.m_data[0] = (local_88 + local_84) * 0.5;
      local_98.m_data[1] = (local_88 - local_84) * 0.5 + 0.5;
      local_98.m_data[3] = 1.0 - local_98.m_data[1];
      local_98.m_data[2] = 1.0 - local_98.m_data[0];
      tcu::operator-((tcu *)&local_78,&local_50,&local_40);
      tcu::operator*((tcu *)&local_68,(Vector<float,_4> *)&local_78,&local_98);
      tcu::operator+((tcu *)&local_d0,&local_40,(Vector<float,_4> *)&local_68);
      castVectorSaturate<int>((Vec4 *)&local_d0);
      castVectorSaturate<unsigned_int>((Vec4 *)&local_d0);
      iVar3 = *(int *)&(local_a8->super_ShaderProgram).field_0x154;
      if (iVar3 == 0x22) {
        pGVar2 = context->outputArray;
        iVar3 = (iVar1 + fragNdx_00) * context->numFragmentOutputs;
        dVar4 = local_78;
        dVar5 = dStack_74;
        dVar6 = dStack_70;
        dVar7 = dStack_6c;
LAB_0113211a:
        pGVar2 = pGVar2 + iVar3;
        (pGVar2->v).uData[0] = dVar4;
        (pGVar2->v).uData[1] = dVar5;
        (pGVar2->v).uData[2] = dVar6;
        (pGVar2->v).uData[3] = dVar7;
      }
      else {
        if (iVar3 == 0x1e) {
          pGVar2 = context->outputArray;
          iVar3 = (iVar1 + fragNdx_00) * context->numFragmentOutputs;
          dVar4 = local_68;
          dVar5 = dStack_64;
          dVar6 = dStack_60;
          dVar7 = dStack_5c;
          goto LAB_0113211a;
        }
        if (iVar3 == 4) {
          pGVar2 = context->outputArray;
          iVar3 = (iVar1 + fragNdx_00) * context->numFragmentOutputs;
          pGVar2[iVar3].v.uData[0] = local_d0;
          pGVar2[iVar3].v.uData[1] = local_cc;
          pGVar2[iVar3].v.uData[2] = local_c8;
          pGVar2[iVar3].v.uData[3] = local_c4;
        }
      }
    }
    local_b0 = local_b0 + 1;
    iVar1 = iVar1 + 4;
  } while( true );
}

Assistant:

void GradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4	gradientMin(m_uniforms[0].value.f4);
	const tcu::Vec4	gradientMax(m_uniforms[1].value.f4);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;
		const float			f1		= 0.5f + (x - y) * 0.5f;
		const tcu::Vec4		fv		= Vec4(f0, f1, 1.0f-f0, 1.0f-f1);

		const tcu::Vec4		color	= gradientMin + (gradientMax-gradientMin) * fv;
		const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
		const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}